

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O3

void RDL_findEdges(char *edges,RDL_cfam *RCF,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  char *visited;
  
  visited = (char *)calloc(1,(ulong)gra->E);
  RDL_giveEdges(RCF->r,RCF->p,edges,gra,spi,visited);
  memset(visited,0,(ulong)gra->E);
  RDL_giveEdges(RCF->r,RCF->q,edges,gra,spi,visited);
  uVar1 = RCF->p;
  if (RCF->x != 0xffffffff) {
    uVar1 = RDL_edgeId(gra,RCF->x,uVar1);
    edges[uVar1] = '\x01';
    uVar1 = RCF->x;
  }
  uVar1 = RDL_edgeId(gra,uVar1,RCF->q);
  edges[uVar1] = '\x01';
  free(visited);
  return;
}

Assistant:

void RDL_findEdges(char *edges, RDL_cfam *RCF, RDL_graph *gra, RDL_sPathInfo *spi)
{
  char* visited;
  visited = malloc(gra->E * sizeof(*visited));
  memset(visited, 0, gra->E * sizeof(*visited));
  RDL_giveEdges(RCF->r, RCF->p, edges, gra, spi, visited);
  memset(visited, 0, gra->E * sizeof(*visited));
  RDL_giveEdges(RCF->r, RCF->q, edges, gra, spi, visited);
  /* we need to add the edges */
  if(RCF->x < UINT_MAX) /*even family*/
  {
    edges[RDL_edgeId(gra, RCF->x, RCF->p)] = 1;
    edges[RDL_edgeId(gra, RCF->x, RCF->q)] = 1;
  }
  else
  {
    edges[RDL_edgeId(gra, RCF->p, RCF->q)] = 1;
  }
  free(visited);
}